

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sight.cpp
# Opt level: O0

int __thiscall SightCheck::init(SightCheck *this,EVP_PKEY_CTX *ctx)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  SightTask *in_RCX;
  sector_t_conflict *in_RDX;
  double *in_R8;
  int in_R9D;
  DVector3 local_78;
  TVector2<double> local_60;
  DVector3 local_50;
  int local_34;
  double *pdStack_30;
  int flags_local;
  SightTask *task_local;
  sector_t_conflict *startsector_local;
  AActor *t2_local;
  AActor *t1_local;
  SightCheck *this_local;
  
  local_34 = in_R9D;
  pdStack_30 = in_R8;
  task_local = in_RCX;
  startsector_local = in_RDX;
  t2_local = (AActor *)ctx;
  t1_local = (AActor *)this;
  AActor::PosRelative(&local_50,(AActor *)ctx,*(int *)((long)in_R8 + 0x1c));
  TVector3<double>::operator=(&this->sightstart,&local_50);
  AActor::PosRelative(&local_78,(AActor *)startsector_local,*(int *)((long)pdStack_30 + 0x1c));
  TVector2<double>::TVector2(&local_60,&local_78);
  TVector2<double>::operator=(&this->sightend,&local_60);
  (this->sightstart).Z = t2_local->Height * 0.75 + (this->sightstart).Z;
  this->Startfrac = *pdStack_30;
  dVar1 = (this->sightstart).Y;
  dVar2 = (this->sightend).X;
  dVar3 = (this->sightstart).X;
  dVar4 = (this->sightend).Y;
  dVar5 = (this->sightstart).Y;
  (this->Trace).x = (this->sightstart).X;
  (this->Trace).y = dVar1;
  (this->Trace).dx = dVar2 - dVar3;
  (this->Trace).dy = dVar4 - dVar5;
  dVar1 = (this->sightstart).Z;
  this->Lastzbottom = dVar1;
  this->Lastztop = dVar1;
  this->lastsector = (sector_t_conflict *)task_local;
  this->seeingthing = (AActor *)startsector_local;
  this->topslope = pdStack_30[1];
  this->bottomslope = pdStack_30[2];
  this->Flags = local_34;
  this->portaldir = *(int *)(pdStack_30 + 3);
  this->portalfound = false;
  this->myseethrough = 0x2000000;
  return (int)this;
}

Assistant:

void init(AActor * t1, AActor * t2, sector_t *startsector, SightTask *task, int flags)
	{
		sightstart = t1->PosRelative(task->portalgroup);
		sightend = t2->PosRelative(task->portalgroup);
		sightstart.Z += t1->Height * 0.75;

		Startfrac = task->Frac;
		Trace = { sightstart.X, sightstart.Y, sightend.X - sightstart.X, sightend.Y - sightstart.Y };
		Lastztop = Lastzbottom = sightstart.Z;
		lastsector = startsector;
		seeingthing=t2;
		topslope = task->topslope;
		bottomslope = task->bottomslope;
		Flags = flags;
		portaldir = task->direction;
		portalfound = false;

		myseethrough = FF_SEETHROUGH;
	}